

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O1

void Gia_ManFromBridgeUnknown(FILE *pFile,int iPoUnknown)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)iPoUnknown;
  fprintf((FILE *)pFile,"%.6d",0x65);
  fputc(0x20,(FILE *)pFile);
  if ((uint)iPoUnknown < 0x80) {
    fprintf((FILE *)pFile,"%.16d",3);
    fputc(0x20,(FILE *)pFile);
    fputc(0,(FILE *)pFile);
    fputc(1,(FILE *)pFile);
  }
  else {
    uVar3 = 3;
    uVar2 = uVar4;
    do {
      uVar3 = (ulong)((int)uVar3 + 1);
      uVar1 = (uint)uVar2;
      uVar2 = uVar2 >> 7;
    } while (0x3fff < uVar1);
    fprintf((FILE *)pFile,"%.16d",uVar3);
    fputc(0x20,(FILE *)pFile);
    fputc(0,(FILE *)pFile);
    fputc(1,(FILE *)pFile);
    if (0x7f < (uint)iPoUnknown) {
      do {
        uVar1 = (uint)uVar4;
        fputc(uVar1 & 0xff | 0x80,(FILE *)pFile);
        uVar4 = uVar4 >> 7;
        iPoUnknown = (int)uVar4;
      } while (0x3fff < uVar1);
    }
  }
  fputc(iPoUnknown,(FILE *)pFile);
  fflush((FILE *)pFile);
  return;
}

Assistant:

void Gia_ManFromBridgeUnknown( FILE * pFile, int iPoUnknown )
{
    fprintf( pFile, "%.6d", 101 /*message type = Result*/);
    fprintf( pFile, " " );
    fprintf( pFile, "%.16d", 2 + aigerNumSize(iPoUnknown) /*size in bytes*/);
    fprintf( pFile, " " );

    fputc( (char)BRIDGE_VALUE_X, pFile ); // undef
    fputc( (char)1, pFile ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsignedFile( pFile, iPoUnknown ); // number of the property (Armin's encoding)
    fflush(pFile);
}